

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void GameLoop::initInstance
               (Map *map,vector<Player_*,_std::allocator<Player_*>_> *playerList,Deck *deck)

{
  GameLoop *this;
  ostream *this_00;
  Deck *deck_local;
  vector<Player_*,_std::allocator<Player_*>_> *playerList_local;
  Map *map_local;
  
  if (gameLoopInstance == (GameLoop *)0x0) {
    this = (GameLoop *)operator_new(0x18);
    GameLoop(this,map,playerList,deck);
    gameLoopInstance = this;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,
                              "Tried to create an instance of GameLoop, but one already exists!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void GameLoop::initInstance(Map* map, vector<Player*>* playerList, Deck* deck) {
    if (GameLoop::gameLoopInstance == nullptr) {
        GameLoop::gameLoopInstance = new GameLoop(map, playerList, deck);
    } else {
        std::cout << "Tried to create an instance of GameLoop, but one already exists!" << std::endl;
    }
}